

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O2

Type __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
operator=(GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
          *this,long value)

{
  ulong uVar1;
  
  if (value < 0) {
    uVar1 = (ulong)(0xffffffff7fffffff < (ulong)value) << 0x35 | 0x96000000000000;
  }
  else {
    uVar1 = 0x1f6000000000000;
    if ((value & 0xffffffff80000000U) != 0) {
      uVar1 = (ulong)((ulong)value >> 0x20 == 0) << 0x36 | 0x196000000000000;
    }
  }
  *(long *)this = value;
  *(ulong *)(this + 8) = uVar1;
  return (Type)this;
}

Assistant:

operator=(T value) {
        GenericValue v(value);
        return *this = v;
    }